

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

uchar * mcmalo0(mcmcxdef *cctx,ushort siz,mcmon *nump,mcmon clinum,int noclitrans)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  mcmon n;
  mcmcxdef *pmVar4;
  mcsseg mVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar9;
  mcmodef *pmVar10;
  uint uVar11;
  undefined6 in_register_0000000a;
  ulong uVar12;
  ushort uVar13;
  ushort siz_00;
  uint uVar14;
  undefined6 in_register_00000032;
  mcmon **ppmVar15;
  mcmodef *o;
  ulong uVar16;
  long *plVar17;
  mcmon n_00;
  mcmcx1def *ctx;
  bool bVar18;
  bool bVar19;
  mcmon glb;
  mcmon newn;
  mcmon local_7e;
  int local_7c;
  uint local_78;
  mcmon local_72;
  uint local_70;
  uint local_6c;
  ulong local_68;
  mcmon *local_60;
  mcmon *local_58;
  mcmcx1def *local_50;
  mcmcxdef *local_48;
  mcscxdef *local_40;
  mcmon *local_38;
  uint uVar8;
  
  uVar16 = CONCAT62(in_register_0000000a,clinum) & 0xffffffff;
  uVar12 = CONCAT62(in_register_00000032,siz) & 0xffffffff;
  ctx = cctx->mcmcxgl;
  local_48 = cctx;
  puVar9 = mcmalo1(ctx,siz,&local_7e);
  iVar7 = noclitrans;
  if (puVar9 == (uchar *)0x0) {
    mcmgarb(ctx);
    puVar9 = mcmalo1(ctx,siz,&local_7e);
    iVar7 = noclitrans;
    if (puVar9 == (uchar *)0x0) {
      local_7c = noclitrans;
      local_70 = (uint)siz;
      if ((short)uVar12 == 0) {
LAB_0021938c:
        puVar9 = mcmalo1(ctx,(ushort)local_70,&local_7e);
        iVar7 = local_7c;
        if (puVar9 == (uchar *)0x0) {
          errsigf(ctx->mcmcxerr,"TADS",0xb);
        }
      }
      else {
        local_58 = &ctx->mcmcxlru;
        local_40 = &ctx->mcmcxswc;
        local_38 = &ctx->mcmcxfre;
        uVar14 = 1;
        uVar13 = 0;
        local_78 = (uint)CONCAT62(in_register_00000032,siz);
        local_68 = uVar16;
        local_60 = nump;
        local_50 = ctx;
        do {
          do {
            n_00 = *local_58;
            uVar6 = uVar14;
            if (n_00 != 0xffff) {
              do {
                local_6c = uVar6;
                pmVar10 = ctx->mcmcxtab[n_00 >> 8];
                uVar16 = (ulong)((n_00 & 0xff) << 5);
                uVar1 = *(ushort *)((long)&pmVar10->mcmonxt + uVar16);
                if (((*(byte *)((long)&pmVar10->mcmoflg + uVar16) & 100) == 0) &&
                   ((plVar17 = (long *)((long)&pmVar10->mcmoptr + uVar16), uVar14 == 2 ||
                    ((ushort)uVar12 <= *(ushort *)(plVar17 + 3))))) {
                  pmVar10 = mcmoal(ctx,&local_72);
                  n = local_72;
                  ctx = local_50;
                  if (local_72 != 0xffff) {
                    uVar2 = *(ushort *)((long)plVar17 + 0x14);
                    if ((uVar2 & 3) != 0) {
                      mVar5 = 0xffff;
                      if ((uVar2 & 2) == 0) {
                        mVar5 = *(mcsseg *)(plVar17 + 1);
                      }
                      mVar5 = mcsout(local_40,(uint)n_00,(uchar *)*plVar17,*(ushort *)(plVar17 + 3),
                                     mVar5,uVar2 & 1);
                      *(mcsseg *)(plVar17 + 1) = mVar5;
                    }
                    ctx = local_50;
                    pmVar10->mcmoptr = (uchar *)*plVar17;
                    pmVar10->mcmosiz = *(ushort *)(plVar17 + 3);
                    pmVar10->mcmoflg = 0x80;
                    *(mcmon *)(*plVar17 + -8) = n;
                    mcmlnkhd(local_50,local_38,n);
                    *(byte *)((long)plVar17 + 0x14) = *(byte *)((long)plVar17 + 0x14) & 0xf7;
                    mcmunl(ctx,n_00,local_58);
                    uVar13 = uVar13 + (short)plVar17[3];
                  }
                  uVar12 = (ulong)local_78;
                  uVar14 = local_6c;
                }
              } while ((uVar1 != 0xffff) &&
                      (n_00 = uVar1, uVar6 = local_6c, uVar13 < (ushort)uVar12));
            }
            nump = local_60;
            uVar16 = local_68;
          } while ((uVar14 < 2) && (uVar14 = uVar14 + 1, uVar13 < (ushort)uVar12));
          if (uVar13 == 0) goto LAB_0021938c;
          siz_00 = (ushort)local_70;
          puVar9 = mcmalo1(ctx,siz_00,&local_7e);
          iVar7 = local_7c;
          if (puVar9 != (uchar *)0x0) break;
          mcmgarb(ctx);
          puVar9 = mcmalo1(ctx,siz_00,&local_7e);
          uVar13 = 0;
          uVar14 = 1;
          uVar12 = (ulong)local_78;
          uVar16 = local_68;
          nump = local_60;
          iVar7 = local_7c;
        } while (puVar9 == (uchar *)0x0);
      }
    }
  }
  pmVar4 = local_48;
  if (iVar7 == 0) {
    if ((short)uVar16 == -1) {
      uVar14 = local_48->mcmcxmsz;
      uVar6 = 0;
      iVar7 = 0;
      bVar18 = uVar14 != 0;
      if (uVar14 == 0) {
        uVar11 = 0xffffffff;
      }
      else {
        ppmVar15 = local_48->mcmcxmtb;
        uVar11 = 0xffffffff;
        do {
          if (*ppmVar15 == (mcmon *)0x0) {
            if (uVar11 == 0xffffffff) {
              uVar11 = uVar6;
            }
            bVar3 = true;
          }
          else {
            uVar16 = 0;
            do {
              bVar19 = (*ppmVar15)[uVar16] == 0xffff;
              bVar3 = !bVar19;
              if (bVar19) goto LAB_00219187;
              uVar16 = uVar16 + 1;
            } while (((uint)uVar16 & 0xffff) != 0x100);
            uVar16 = CONCAT62((int6)(uVar16 >> 0x10),0x100);
          }
LAB_00219187:
          uVar8 = uVar6;
          if (!bVar3) break;
          uVar6 = uVar6 + 1;
          ppmVar15 = ppmVar15 + 1;
          bVar18 = uVar6 < uVar14;
          uVar8 = uVar14;
        } while (uVar6 != uVar14);
        iVar7 = uVar8 << 8;
      }
      if (bVar18) {
        uVar16 = (ulong)(uint)((int)uVar16 + iVar7);
      }
      else {
        if (uVar11 == 0xffffffff) {
          errsigf(ctx->mcmcxerr,"TADS",10);
        }
        uVar16 = (ulong)(uVar11 << 8);
      }
    }
    local_68 = uVar16;
    mcmcliexp(local_48,(mcmon)uVar16);
    if (pmVar4->mcmcxmtb[(uVar16 & 0xffff) >> 8][uVar16 & 0xff] != 0xffff) {
      errsigf(ctx->mcmcxerr,"TADS",9);
    }
    pmVar4->mcmcxmtb[(uVar16 & 0xffff) >> 8][uVar16 & 0xff] = local_7e;
    local_7e = (mcmon)local_68;
    if (nump == (mcmon *)0x0) {
      return puVar9;
    }
  }
  *nump = local_7e;
  return puVar9;
}

Assistant:

uchar *mcmalo0(mcmcxdef *cctx, ushort siz, mcmon *nump,
               mcmon clinum, int noclitrans)
{
    uchar     *ret;
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* try once */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;

    /* collect some garbage */
    mcmgarb(ctx);
    
    /* try swapping until we get the memory or have nothing left to swap */
    for ( ;; )
    {
        /* try again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* nothing left to swap? */
        if (!mcmswap(ctx, siz))
            break;

        /* try yet again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* collect garbage once again */        
        mcmgarb(ctx);
    }
    
    /* try again */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;
    
    /* we have no other way of getting more memory, so signal an error */
    errsig(ctx->mcmcxerr, ERR_NOMEM1);
    NOTREACHEDV(uchar *);
    
done:
    if (noclitrans)
    {
        *nump = glb;
        return(ret);
    }
    
    /* we have an object - generate client number */
    if (clinum == MCMONINV)
    {
        /* find a free number */
        mcmon **p;
        uint    i;
        mcmon   j;
        mcmon  *q;
        int     found = FALSE;
        int     unused = -1;
        
        for (i = 0, p = cctx->mcmcxmtb ; i < cctx->mcmcxmsz ; ++i, ++p)
        {
            if (*p)
            {
                for (j = 0, q = *p ; j < 256 ; ++j, ++q)
                {
                    if (*q == MCMONINV)
                    {
                        found = TRUE;
                        break;
                    }
                }
            }
            else if (unused == -1)
                unused = i;            /* note an unused page mapping table */

            if (found) break;
        }
        
        if (found)
            clinum = (i << 8) + j;
        else if (unused != -1)
            clinum = (unused << 8);
        else
            errsig(ctx->mcmcxerr, ERR_CLIFULL);
    }

    /* expand client mapping table if necessary */
    mcmcliexp(cctx, clinum);

    /* make sure the entry isn't already in use */
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);

    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
    if (nump) *nump = clinum;
    return(ret);
}